

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Frodo640.c
# Opt level: O2

uint32_t Hacl_Frodo640_crypto_kem_dec(uint8_t *ss,uint8_t *ct,uint8_t *sk)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t i0;
  uint uVar4;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  uint32_t i_1;
  long lVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  uint32_t n;
  uint32_t logq;
  uint32_t logq_00;
  uint8_t *seed;
  uint16_t *puVar8;
  uint32_t n_00;
  uint16_t *in_R8;
  uint16_t *in_R9;
  uint32_t i;
  long lVar9;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 auVar10 [16];
  uint8_t auStack_de9e8 [9720];
  undefined8 uStack_dc3f0;
  undefined8 uStack_dc3e8;
  undefined8 uStack_dc3e0;
  undefined8 uStack_dc3d8;
  undefined8 uStack_dc3d0;
  undefined8 uStack_dc3c8;
  uint8_t auStack_dc3c0 [16];
  uint16_t a_matrix [409600];
  uint16_t b_matrix [5120];
  uint8_t r [20608];
  uint16_t sp_matrix [5120];
  uint16_t bpp_matrix [5120];
  uint16_t bp_matrix [5120];
  uint16_t s_matrix [5120];
  uint16_t ep_matrix [5120];
  uint16_t mu_encode [64];
  uint16_t c_matrix [64];
  uint16_t cp_matrix [64];
  uint16_t epp_matrix [64];
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  undefined8 uStack_108;
  uint8_t seed_se_k [32];
  uint16_t m_matrix [64];
  undefined8 uStack_48;
  uint8_t mu_decode [16];
  
  lVar9 = 0;
  auStack_dc3c0[0] = 0xc0;
  auStack_dc3c0[1] = 'm';
  auStack_dc3c0[2] = '\x15';
  auStack_dc3c0[3] = '\0';
  auStack_dc3c0[4] = '\0';
  auStack_dc3c0[5] = '\0';
  auStack_dc3c0[6] = '\0';
  auStack_dc3c0[7] = '\0';
  memset(bpp_matrix + 0x13fc,0,0x2800);
  puVar8 = mu_encode + 0x3c;
  c_matrix[0x34] = 0;
  c_matrix[0x35] = 0;
  c_matrix[0x36] = 0;
  c_matrix[0x37] = 0;
  c_matrix[0x38] = 0;
  c_matrix[0x39] = 0;
  c_matrix[0x3a] = 0;
  c_matrix[0x3b] = 0;
  c_matrix[0x2c] = 0;
  c_matrix[0x2d] = 0;
  c_matrix[0x2e] = 0;
  c_matrix[0x2f] = 0;
  c_matrix[0x30] = 0;
  c_matrix[0x31] = 0;
  c_matrix[0x32] = 0;
  c_matrix[0x33] = 0;
  c_matrix[0x24] = 0;
  c_matrix[0x25] = 0;
  c_matrix[0x26] = 0;
  c_matrix[0x27] = 0;
  c_matrix[0x28] = 0;
  c_matrix[0x29] = 0;
  c_matrix[0x2a] = 0;
  c_matrix[0x2b] = 0;
  c_matrix[0x1c] = 0;
  c_matrix[0x1d] = 0;
  c_matrix[0x1e] = 0;
  c_matrix[0x1f] = 0;
  c_matrix[0x20] = 0;
  c_matrix[0x21] = 0;
  c_matrix[0x22] = 0;
  c_matrix[0x23] = 0;
  c_matrix[0x14] = 0;
  c_matrix[0x15] = 0;
  c_matrix[0x16] = 0;
  c_matrix[0x17] = 0;
  c_matrix[0x18] = 0;
  c_matrix[0x19] = 0;
  c_matrix[0x1a] = 0;
  c_matrix[0x1b] = 0;
  c_matrix[0xc] = 0;
  c_matrix[0xd] = 0;
  c_matrix[0xe] = 0;
  c_matrix[0xf] = 0;
  c_matrix[0x10] = 0;
  c_matrix[0x11] = 0;
  c_matrix[0x12] = 0;
  c_matrix[0x13] = 0;
  c_matrix[4] = 0;
  c_matrix[5] = 0;
  c_matrix[6] = 0;
  c_matrix[7] = 0;
  c_matrix[8] = 0;
  c_matrix[9] = 0;
  c_matrix[10] = 0;
  c_matrix[0xb] = 0;
  mu_encode[0x3c] = 0;
  mu_encode[0x3d] = 0;
  mu_encode[0x3e] = 0;
  mu_encode[0x3f] = 0;
  c_matrix[0] = 0;
  c_matrix[1] = 0;
  c_matrix[2] = 0;
  c_matrix[3] = 0;
  mu_decode._8_8_ = ct + 0x2580;
  builtin_memcpy(auStack_dc3c0,"\x14n\x15",4);
  auStack_dc3c0[4] = '\0';
  auStack_dc3c0[5] = '\0';
  auStack_dc3c0[6] = '\0';
  auStack_dc3c0[7] = '\0';
  Hacl_Impl_Frodo_Pack_frodo_unpack(8,0x280,(uint32_t)ct,(uint8_t *)(bpp_matrix + 0x13fc),in_R8);
  builtin_memcpy(auStack_dc3c0,"&n\x15",4);
  auStack_dc3c0[4] = '\0';
  auStack_dc3c0[5] = '\0';
  auStack_dc3c0[6] = '\0';
  auStack_dc3c0[7] = '\0';
  Hacl_Impl_Frodo_Pack_frodo_unpack(8,8,(uint32_t)mu_decode._8_8_,(uint8_t *)puVar8,in_R8);
  uStack_48 = 0;
  mu_decode[0] = '\0';
  mu_decode[1] = '\0';
  mu_decode[2] = '\0';
  mu_decode[3] = '\0';
  mu_decode[4] = '\0';
  mu_decode[5] = '\0';
  mu_decode[6] = '\0';
  mu_decode[7] = '\0';
  builtin_memcpy(auStack_dc3c0,"@n\x15",4);
  auStack_dc3c0[4] = '\0';
  auStack_dc3c0[5] = '\0';
  auStack_dc3c0[6] = '\0';
  auStack_dc3c0[7] = '\0';
  memset(bp_matrix + 0x13fc,0,0x2800);
  m_matrix[0x34] = 0;
  m_matrix[0x35] = 0;
  m_matrix[0x36] = 0;
  m_matrix[0x37] = 0;
  m_matrix[0x38] = 0;
  m_matrix[0x39] = 0;
  m_matrix[0x3a] = 0;
  m_matrix[0x3b] = 0;
  m_matrix[0x2c] = 0;
  m_matrix[0x2d] = 0;
  m_matrix[0x2e] = 0;
  m_matrix[0x2f] = 0;
  m_matrix[0x30] = 0;
  m_matrix[0x31] = 0;
  m_matrix[0x32] = 0;
  m_matrix[0x33] = 0;
  m_matrix[0x24] = 0;
  m_matrix[0x25] = 0;
  m_matrix[0x26] = 0;
  m_matrix[0x27] = 0;
  m_matrix[0x28] = 0;
  m_matrix[0x29] = 0;
  m_matrix[0x2a] = 0;
  m_matrix[0x2b] = 0;
  m_matrix[0x1c] = 0;
  m_matrix[0x1d] = 0;
  m_matrix[0x1e] = 0;
  m_matrix[0x1f] = 0;
  m_matrix[0x20] = 0;
  m_matrix[0x21] = 0;
  m_matrix[0x22] = 0;
  m_matrix[0x23] = 0;
  m_matrix[0x14] = 0;
  m_matrix[0x15] = 0;
  m_matrix[0x16] = 0;
  m_matrix[0x17] = 0;
  m_matrix[0x18] = 0;
  m_matrix[0x19] = 0;
  m_matrix[0x1a] = 0;
  m_matrix[0x1b] = 0;
  m_matrix[0xc] = 0;
  m_matrix[0xd] = 0;
  m_matrix[0xe] = 0;
  m_matrix[0xf] = 0;
  m_matrix[0x10] = 0;
  m_matrix[0x11] = 0;
  m_matrix[0x12] = 0;
  m_matrix[0x13] = 0;
  m_matrix[4] = 0;
  m_matrix[5] = 0;
  m_matrix[6] = 0;
  m_matrix[7] = 0;
  m_matrix[8] = 0;
  m_matrix[9] = 0;
  m_matrix[10] = 0;
  m_matrix[0xb] = 0;
  seed_se_k[0x18] = '\0';
  seed_se_k[0x19] = '\0';
  seed_se_k[0x1a] = '\0';
  seed_se_k[0x1b] = '\0';
  seed_se_k[0x1c] = '\0';
  seed_se_k[0x1d] = '\0';
  seed_se_k[0x1e] = '\0';
  seed_se_k[0x1f] = '\0';
  m_matrix[0] = 0;
  m_matrix[1] = 0;
  m_matrix[2] = 0;
  m_matrix[3] = 0;
  for (; lVar9 != 0x1400; lVar9 = lVar9 + 1) {
    bp_matrix[lVar9 + 0x13fc] = *(uint16_t *)(sk + lVar9 * 2 + 0x25a0);
  }
  puVar6 = (uint16_t *)(seed_se_k + 0x18);
  auStack_dc3c0[0] = 0xb5;
  auStack_dc3c0[1] = 'n';
  auStack_dc3c0[2] = '\x15';
  auStack_dc3c0[3] = '\0';
  auStack_dc3c0[4] = '\0';
  auStack_dc3c0[5] = '\0';
  auStack_dc3c0[6] = '\0';
  auStack_dc3c0[7] = '\0';
  Hacl_Impl_Matrix_matrix_mul_s
            (8,(int)bpp_matrix + 0x27f8,(int)bp_matrix + 0x27f8,puVar6,in_R8,in_R9);
  for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      puVar6[lVar5] = puVar8[lVar5] - puVar6[lVar5];
    }
    puVar8 = puVar8 + 8;
    puVar6 = puVar6 + 8;
  }
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 2) {
    *(uint16_t *)(mu_decode + lVar9 + -8) =
         m_matrix[lVar9 * 4 + 3] * 2 + 0x2000 & 0xc000 |
         (ushort)(*(int *)(m_matrix + lVar9 * 4 + 2) + 0x1000U >> 1) & 0x3000 |
         (ushort)(m_matrix[lVar9 * 4 + 1] + 0x1000 >> 3) & 0xc00 |
         (ushort)(*(int *)(m_matrix + lVar9 * 4) + 0x1000U >> 5) & 0x300 |
         (ushort)(m_matrix[lVar9 * 4 + -1] + 0x1000 >> 7) & 0xc0 |
         (ushort)(*(int *)(m_matrix + lVar9 * 4 + -2) + 0x1000U >> 9) & 0x30 |
         (ushort)(m_matrix[lVar9 * 4 + -3] + 0x1000 >> 0xb) & 0xc |
         (ushort)(*(int *)(m_matrix + lVar9 * 4 + -4) + 0x1000U >> 0xd) & 3;
  }
  auStack_dc3c0[0] = 0xaf;
  auStack_dc3c0[1] = 'o';
  auStack_dc3c0[2] = '\x15';
  auStack_dc3c0[3] = '\0';
  auStack_dc3c0[4] = '\0';
  auStack_dc3c0[5] = '\0';
  auStack_dc3c0[6] = '\0';
  auStack_dc3c0[7] = '\0';
  Lib_Memzero0_memzero0(bp_matrix + 0x13fc,0x2800);
  auStack_dc3c0[0] = 0xc0;
  auStack_dc3c0[1] = 'o';
  auStack_dc3c0[2] = '\x15';
  auStack_dc3c0[3] = '\0';
  auStack_dc3c0[4] = '\0';
  auStack_dc3c0[5] = '\0';
  auStack_dc3c0[6] = '\0';
  auStack_dc3c0[7] = '\0';
  Lib_Memzero0_memzero0(seed_se_k + 0x18,0x80);
  seed_se_k[8] = '\0';
  seed_se_k[9] = '\0';
  seed_se_k[10] = '\0';
  seed_se_k[0xb] = '\0';
  seed_se_k[0xc] = '\0';
  seed_se_k[0xd] = '\0';
  seed_se_k[0xe] = '\0';
  seed_se_k[0xf] = '\0';
  seed_se_k[0x10] = '\0';
  seed_se_k[0x11] = '\0';
  seed_se_k[0x12] = '\0';
  seed_se_k[0x13] = '\0';
  seed_se_k[0x14] = '\0';
  seed_se_k[0x15] = '\0';
  seed_se_k[0x16] = '\0';
  seed_se_k[0x17] = '\0';
  uStack_108 = 0;
  seed_se_k[0] = '\0';
  seed_se_k[1] = '\0';
  seed_se_k[2] = '\0';
  seed_se_k[3] = '\0';
  seed_se_k[4] = '\0';
  seed_se_k[5] = '\0';
  seed_se_k[6] = '\0';
  seed_se_k[7] = '\0';
  uStack_dc3d8 = *(undefined8 *)(sk + 0x4da0);
  uStack_dc3d0 = *(undefined8 *)(sk + 0x4da8);
  uStack_dc3c8 = uStack_48;
  auStack_dc3c0[0] = mu_decode[0];
  auStack_dc3c0[1] = mu_decode[1];
  auStack_dc3c0[2] = mu_decode[2];
  auStack_dc3c0[3] = mu_decode[3];
  auStack_dc3c0[4] = mu_decode[4];
  auStack_dc3c0[5] = mu_decode[5];
  auStack_dc3c0[6] = mu_decode[6];
  auStack_dc3c0[7] = mu_decode[7];
  uStack_dc3e0 = 0x157003;
  mu_decode._8_8_ = auStack_dc3c0 + 8;
  Hacl_Hash_SHA3_shake128((uint8_t *)&uStack_108,0x20,(uint8_t *)&uStack_dc3d8,0x20);
  uStack_dc3e0 = 0x157016;
  memset(sp_matrix + 0x13fc,0,0x2800);
  cp_matrix[0x34] = 0;
  cp_matrix[0x35] = 0;
  cp_matrix[0x36] = 0;
  cp_matrix[0x37] = 0;
  cp_matrix[0x38] = 0;
  cp_matrix[0x39] = 0;
  cp_matrix[0x3a] = 0;
  cp_matrix[0x3b] = 0;
  cp_matrix[0x2c] = 0;
  cp_matrix[0x2d] = 0;
  cp_matrix[0x2e] = 0;
  cp_matrix[0x2f] = 0;
  cp_matrix[0x30] = 0;
  cp_matrix[0x31] = 0;
  cp_matrix[0x32] = 0;
  cp_matrix[0x33] = 0;
  cp_matrix[0x24] = 0;
  cp_matrix[0x25] = 0;
  cp_matrix[0x26] = 0;
  cp_matrix[0x27] = 0;
  cp_matrix[0x28] = 0;
  cp_matrix[0x29] = 0;
  cp_matrix[0x2a] = 0;
  cp_matrix[0x2b] = 0;
  cp_matrix[0x1c] = 0;
  cp_matrix[0x1d] = 0;
  cp_matrix[0x1e] = 0;
  cp_matrix[0x1f] = 0;
  cp_matrix[0x20] = 0;
  cp_matrix[0x21] = 0;
  cp_matrix[0x22] = 0;
  cp_matrix[0x23] = 0;
  cp_matrix[0x14] = 0;
  cp_matrix[0x15] = 0;
  cp_matrix[0x16] = 0;
  cp_matrix[0x17] = 0;
  cp_matrix[0x18] = 0;
  cp_matrix[0x19] = 0;
  cp_matrix[0x1a] = 0;
  cp_matrix[0x1b] = 0;
  cp_matrix[0xc] = 0;
  cp_matrix[0xd] = 0;
  cp_matrix[0xe] = 0;
  cp_matrix[0xf] = 0;
  cp_matrix[0x10] = 0;
  cp_matrix[0x11] = 0;
  cp_matrix[0x12] = 0;
  cp_matrix[0x13] = 0;
  cp_matrix[4] = 0;
  cp_matrix[5] = 0;
  cp_matrix[6] = 0;
  cp_matrix[7] = 0;
  cp_matrix[8] = 0;
  cp_matrix[9] = 0;
  cp_matrix[10] = 0;
  cp_matrix[0xb] = 0;
  c_matrix[0x3c] = 0;
  c_matrix[0x3d] = 0;
  c_matrix[0x3e] = 0;
  c_matrix[0x3f] = 0;
  cp_matrix[0] = 0;
  cp_matrix[1] = 0;
  cp_matrix[2] = 0;
  cp_matrix[3] = 0;
  puVar8 = (uint16_t *)(r + 0x5078);
  uStack_dc3e0 = 0x157055;
  memset(puVar8,0,0x2800);
  uStack_dc3e0 = 0x157068;
  memset(s_matrix + 0x13fc,0,0x2800);
  puVar6 = cp_matrix + 0x3c;
  epp_matrix[0x34] = 0;
  epp_matrix[0x35] = 0;
  epp_matrix[0x36] = 0;
  epp_matrix[0x37] = 0;
  epp_matrix[0x38] = 0;
  epp_matrix[0x39] = 0;
  epp_matrix[0x3a] = 0;
  epp_matrix[0x3b] = 0;
  epp_matrix[0x2c] = 0;
  epp_matrix[0x2d] = 0;
  epp_matrix[0x2e] = 0;
  epp_matrix[0x2f] = 0;
  epp_matrix[0x30] = 0;
  epp_matrix[0x31] = 0;
  epp_matrix[0x32] = 0;
  epp_matrix[0x33] = 0;
  epp_matrix[0x24] = 0;
  epp_matrix[0x25] = 0;
  epp_matrix[0x26] = 0;
  epp_matrix[0x27] = 0;
  epp_matrix[0x28] = 0;
  epp_matrix[0x29] = 0;
  epp_matrix[0x2a] = 0;
  epp_matrix[0x2b] = 0;
  epp_matrix[0x1c] = 0;
  epp_matrix[0x1d] = 0;
  epp_matrix[0x1e] = 0;
  epp_matrix[0x1f] = 0;
  epp_matrix[0x20] = 0;
  epp_matrix[0x21] = 0;
  epp_matrix[0x22] = 0;
  epp_matrix[0x23] = 0;
  epp_matrix[0x14] = 0;
  epp_matrix[0x15] = 0;
  epp_matrix[0x16] = 0;
  epp_matrix[0x17] = 0;
  epp_matrix[0x18] = 0;
  epp_matrix[0x19] = 0;
  epp_matrix[0x1a] = 0;
  epp_matrix[0x1b] = 0;
  epp_matrix[0xc] = 0;
  epp_matrix[0xd] = 0;
  epp_matrix[0xe] = 0;
  epp_matrix[0xf] = 0;
  epp_matrix[0x10] = 0;
  epp_matrix[0x11] = 0;
  epp_matrix[0x12] = 0;
  epp_matrix[0x13] = 0;
  epp_matrix[4] = 0;
  epp_matrix[5] = 0;
  epp_matrix[6] = 0;
  epp_matrix[7] = 0;
  epp_matrix[8] = 0;
  epp_matrix[9] = 0;
  epp_matrix[10] = 0;
  epp_matrix[0xb] = 0;
  cp_matrix[0x3c] = 0;
  cp_matrix[0x3d] = 0;
  cp_matrix[0x3e] = 0;
  cp_matrix[0x3f] = 0;
  epp_matrix[0] = 0;
  epp_matrix[1] = 0;
  epp_matrix[2] = 0;
  epp_matrix[3] = 0;
  puVar1 = b_matrix + 0x13fc;
  uStack_dc3e0 = 0x1570a7;
  memset(puVar1,0,0x5080);
  epp_matrix[0x3c]._0_1_ = 0x96;
  stack0xfffffffffffffec9 = uStack_108;
  uStack_dc3e0 = 0x1570d6;
  Hacl_Hash_SHA3_shake128((uint8_t *)puVar1,0x5080,(uint8_t *)(epp_matrix + 0x3c),0x11);
  uStack_dc3e0 = 0x1570e1;
  Lib_Memzero0_memzero0(epp_matrix + 0x3c,0x11);
  uStack_dc3e0 = 0x1570fb;
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8,0x280,(uint8_t *)puVar1,puVar8);
  uStack_dc3e0 = 0x157116;
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8,0x280,r + 0x27f8,s_matrix + 0x13fc);
  uStack_dc3e0 = 0x15712b;
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8,8,r + 0x4ff8,puVar6);
  uStack_dc3e0 = 0x15714d;
  memset(auStack_dc3c0 + 8,0,0xc8000);
  uStack_dc3e0 = 0x157158;
  n_00 = (uint32_t)(auStack_dc3c0 + 8);
  Hacl_Impl_Frodo_Params_frodo_gen_matrix((char)sk + '\x10',n_00,seed,puVar6);
  uStack_dc3e0 = 0x157172;
  Hacl_Impl_Matrix_matrix_mul(0x280,(uint32_t)puVar8,n_00,sp_matrix + 0x13fc,in_R8,in_R9);
  uStack_dc3e0 = 0x157189;
  Hacl_Impl_Matrix_matrix_add(8,0x280,sp_matrix + 0x13fc,s_matrix + 0x13fc);
  puVar6 = a_matrix + 0x63ffc;
  uStack_dc3e0 = 0x15719f;
  memset(puVar6,0,0x2800);
  uStack_dc3e0 = 0x1571b3;
  Hacl_Impl_Frodo_Pack_frodo_unpack(0x280,8,(int)sk + 0x20,(uint8_t *)puVar6,in_R8);
  puVar1 = c_matrix + 0x3c;
  uStack_dc3e0 = 0x1571cb;
  Hacl_Impl_Matrix_matrix_mul(8,(uint32_t)puVar8,(uint32_t)puVar6,puVar1,in_R8,in_R9);
  puVar8 = cp_matrix + 0x3c;
  uStack_dc3e0 = 0x1571e3;
  puVar7 = puVar8;
  Hacl_Impl_Matrix_matrix_add(8,8,puVar1,puVar8);
  puVar6 = ep_matrix + 0x13fc;
  mu_encode[0x34] = 0;
  mu_encode[0x35] = 0;
  mu_encode[0x36] = 0;
  mu_encode[0x37] = 0;
  mu_encode[0x38] = 0;
  mu_encode[0x39] = 0;
  mu_encode[0x3a] = 0;
  mu_encode[0x3b] = 0;
  mu_encode[0x2c] = 0;
  mu_encode[0x2d] = 0;
  mu_encode[0x2e] = 0;
  mu_encode[0x2f] = 0;
  mu_encode[0x30] = 0;
  mu_encode[0x31] = 0;
  mu_encode[0x32] = 0;
  mu_encode[0x33] = 0;
  mu_encode[0x24] = 0;
  mu_encode[0x25] = 0;
  mu_encode[0x26] = 0;
  mu_encode[0x27] = 0;
  mu_encode[0x28] = 0;
  mu_encode[0x29] = 0;
  mu_encode[0x2a] = 0;
  mu_encode[0x2b] = 0;
  mu_encode[0x1c] = 0;
  mu_encode[0x1d] = 0;
  mu_encode[0x1e] = 0;
  mu_encode[0x1f] = 0;
  mu_encode[0x20] = 0;
  mu_encode[0x21] = 0;
  mu_encode[0x22] = 0;
  mu_encode[0x23] = 0;
  mu_encode[0x14] = 0;
  mu_encode[0x15] = 0;
  mu_encode[0x16] = 0;
  mu_encode[0x17] = 0;
  mu_encode[0x18] = 0;
  mu_encode[0x19] = 0;
  mu_encode[0x1a] = 0;
  mu_encode[0x1b] = 0;
  mu_encode[0xc] = 0;
  mu_encode[0xd] = 0;
  mu_encode[0xe] = 0;
  mu_encode[0xf] = 0;
  mu_encode[0x10] = 0;
  mu_encode[0x11] = 0;
  mu_encode[0x12] = 0;
  mu_encode[0x13] = 0;
  mu_encode[4] = 0;
  mu_encode[5] = 0;
  mu_encode[6] = 0;
  mu_encode[7] = 0;
  mu_encode[8] = 0;
  mu_encode[9] = 0;
  mu_encode[10] = 0;
  mu_encode[0xb] = 0;
  ep_matrix[0x13fc] = 0;
  ep_matrix[0x13fd] = 0;
  ep_matrix[0x13fe] = 0;
  ep_matrix[0x13ff] = 0;
  mu_encode[0] = 0;
  mu_encode[1] = 0;
  mu_encode[2] = 0;
  mu_encode[3] = 0;
  uStack_dc3e0 = 0x157218;
  Hacl_Impl_Frodo_Encode_frodo_key_encode
            ((uint32_t)&uStack_48,(uint32_t)puVar6,n,(uint8_t *)puVar7,in_R8);
  uStack_dc3e0 = 0x157229;
  puVar7 = puVar6;
  Hacl_Impl_Matrix_matrix_add(8,8,puVar1,puVar6);
  uStack_dc3e0 = 0x157236;
  Lib_Memzero0_memzero0(puVar6,0x80);
  uStack_dc3e0 = 0x15724a;
  Hacl_Impl_Matrix_mod_pow2(0x280,(uint32_t)(sp_matrix + 0x13fc),logq,puVar7);
  uStack_dc3e0 = 0x157255;
  Hacl_Impl_Matrix_mod_pow2(8,(uint32_t)puVar1,logq_00,puVar7);
  uStack_dc3e0 = 0x157266;
  Lib_Memzero0_memzero0(r + 0x5078,0x2800);
  uStack_dc3e0 = 0x157277;
  Lib_Memzero0_memzero0(s_matrix + 0x13fc,0x2800);
  uStack_dc3e0 = 0x157284;
  Lib_Memzero0_memzero0(puVar8,0x80);
  uStack_dc3e0 = 0x157298;
  uVar2 = Hacl_Impl_Matrix_matrix_eq(0x280,(int)bpp_matrix + 0x27f8,sp_matrix + 0x13fc,puVar7);
  uStack_dc3e0 = 0x1572ac;
  uVar3 = Hacl_Impl_Matrix_matrix_eq(8,(int)mu_encode + 0x78,puVar1,puVar7);
  uVar4 = (uint)CONCAT62(extraout_var_00,uVar3) & (uint)CONCAT62(extraout_var,uVar2);
  uVar13 = (undefined1)(uVar4 >> 0x18);
  uVar12 = (undefined1)(uVar4 >> 0x10);
  uVar11 = (undefined1)(uVar4 >> 8);
  auVar10._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar13,uVar13),uVar12),CONCAT14(uVar12,uVar4)) >> 0x20);
  auVar10[3] = uVar11;
  auVar10[2] = uVar11;
  auVar10[0] = (undefined1)uVar4;
  auVar10[1] = auVar10[0];
  auVar10._8_8_ = 0;
  auVar10 = pshuflw(auVar10,auVar10,0);
  uVar4 = auVar10._0_4_;
  local_118 = uVar4 & seed_se_k._8_4_ | ~uVar4 & *(uint *)sk;
  uStack_114 = uVar4 & seed_se_k._12_4_ | ~uVar4 & *(uint *)(sk + 4);
  uStack_110 = uVar4 & seed_se_k._16_4_ | ~uVar4 & *(uint *)(sk + 8);
  uStack_10c = uVar4 & seed_se_k._20_4_ | ~uVar4 & *(uint *)(sk + 0xc);
  memcpy(auStack_de9e8,ct,0x25f8);
  uStack_dc3f0 = CONCAT44(uStack_114,local_118);
  uStack_dc3e8 = CONCAT44(uStack_10c,uStack_110);
  Hacl_Hash_SHA3_shake128(ss,0x10,auStack_de9e8,0x2608);
  Lib_Memzero0_memzero0(auStack_de9e8,0x2608);
  Lib_Memzero0_memzero0(&local_118,0x10);
  Lib_Memzero0_memzero0(&uStack_108,0x20);
  Lib_Memzero0_memzero0(&uStack_48,0x10);
  return 0;
}

Assistant:

uint32_t Hacl_Frodo640_crypto_kem_dec(uint8_t *ss, uint8_t *ct, uint8_t *sk)
{
  uint16_t bp_matrix[5120U] = { 0U };
  uint16_t c_matrix[64U] = { 0U };
  uint8_t *c1 = ct;
  uint8_t *c2 = ct + 9600U;
  Hacl_Impl_Frodo_Pack_frodo_unpack(8U, 640U, 15U, c1, bp_matrix);
  Hacl_Impl_Frodo_Pack_frodo_unpack(8U, 8U, 15U, c2, c_matrix);
  uint8_t mu_decode[16U] = { 0U };
  uint8_t *s_bytes = sk + 9632U;
  uint16_t s_matrix[5120U] = { 0U };
  uint16_t m_matrix[64U] = { 0U };
  Hacl_Impl_Matrix_matrix_from_lbytes(640U, 8U, s_bytes, s_matrix);
  Hacl_Impl_Matrix_matrix_mul_s(8U, 640U, 8U, bp_matrix, s_matrix, m_matrix);
  Hacl_Impl_Matrix_matrix_sub(8U, 8U, c_matrix, m_matrix);
  Hacl_Impl_Frodo_Encode_frodo_key_decode(15U, 2U, 8U, m_matrix, mu_decode);
  Lib_Memzero0_memzero(s_matrix, 5120U, uint16_t, void *);
  Lib_Memzero0_memzero(m_matrix, 64U, uint16_t, void *);
  uint8_t seed_se_k[32U] = { 0U };
  uint32_t pkh_mu_decode_len = 32U;
  KRML_CHECK_SIZE(sizeof (uint8_t), pkh_mu_decode_len);
  uint8_t pkh_mu_decode[pkh_mu_decode_len];
  memset(pkh_mu_decode, 0U, pkh_mu_decode_len * sizeof (uint8_t));
  uint8_t *pkh = sk + 19872U;
  memcpy(pkh_mu_decode, pkh, 16U * sizeof (uint8_t));
  memcpy(pkh_mu_decode + 16U, mu_decode, 16U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake128(seed_se_k, 32U, pkh_mu_decode, pkh_mu_decode_len);
  uint8_t *seed_se = seed_se_k;
  uint8_t *kp = seed_se_k + 16U;
  uint8_t *s = sk;
  uint16_t bpp_matrix[5120U] = { 0U };
  uint16_t cp_matrix[64U] = { 0U };
  uint16_t sp_matrix[5120U] = { 0U };
  uint16_t ep_matrix[5120U] = { 0U };
  uint16_t epp_matrix[64U] = { 0U };
  uint8_t r[20608U] = { 0U };
  uint8_t shake_input_seed_se[17U] = { 0U };
  shake_input_seed_se[0U] = 0x96U;
  memcpy(shake_input_seed_se + 1U, seed_se, 16U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake128(r, 20608U, shake_input_seed_se, 17U);
  Lib_Memzero0_memzero(shake_input_seed_se, 17U, uint8_t, void *);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8U, 640U, r, sp_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8U, 640U, r + 10240U, ep_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8U, 8U, r + 20480U, epp_matrix);
  uint8_t *pk = sk + 16U;
  uint8_t *seed_a = pk;
  uint8_t *b = pk + 16U;
  KRML_CHECK_SIZE(sizeof (uint16_t), 409600U);
  uint16_t a_matrix[409600U] = { 0U };
  Hacl_Impl_Frodo_Params_frodo_gen_matrix(Spec_Frodo_Params_SHAKE128, 640U, seed_a, a_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 640U, 640U, sp_matrix, a_matrix, bpp_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 640U, bpp_matrix, ep_matrix);
  uint16_t b_matrix[5120U] = { 0U };
  Hacl_Impl_Frodo_Pack_frodo_unpack(640U, 8U, 15U, b, b_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 640U, 8U, sp_matrix, b_matrix, cp_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, cp_matrix, epp_matrix);
  uint16_t mu_encode[64U] = { 0U };
  Hacl_Impl_Frodo_Encode_frodo_key_encode(15U, 2U, 8U, mu_decode, mu_encode);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, cp_matrix, mu_encode);
  Lib_Memzero0_memzero(mu_encode, 64U, uint16_t, void *);
  Hacl_Impl_Matrix_mod_pow2(8U, 640U, 15U, bpp_matrix);
  Hacl_Impl_Matrix_mod_pow2(8U, 8U, 15U, cp_matrix);
  Lib_Memzero0_memzero(sp_matrix, 5120U, uint16_t, void *);
  Lib_Memzero0_memzero(ep_matrix, 5120U, uint16_t, void *);
  Lib_Memzero0_memzero(epp_matrix, 64U, uint16_t, void *);
  uint16_t b1 = Hacl_Impl_Matrix_matrix_eq(8U, 640U, bp_matrix, bpp_matrix);
  uint16_t b2 = Hacl_Impl_Matrix_matrix_eq(8U, 8U, c_matrix, cp_matrix);
  uint16_t mask = (uint32_t)b1 & (uint32_t)b2;
  uint16_t mask0 = mask;
  uint8_t kp_s[16U] = { 0U };
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    uint8_t *os = kp_s;
    uint8_t uu____0 = s[i];
    uint8_t
    x = (uint32_t)uu____0 ^ ((uint32_t)(uint8_t)mask0 & ((uint32_t)kp[i] ^ (uint32_t)uu____0));
    os[i] = x;);
  uint32_t ss_init_len = 9736U;
  KRML_CHECK_SIZE(sizeof (uint8_t), ss_init_len);
  uint8_t ss_init[ss_init_len];
  memset(ss_init, 0U, ss_init_len * sizeof (uint8_t));
  memcpy(ss_init, ct, 9720U * sizeof (uint8_t));
  memcpy(ss_init + 9720U, kp_s, 16U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake128(ss, 16U, ss_init, ss_init_len);
  Lib_Memzero0_memzero(ss_init, ss_init_len, uint8_t, void *);
  Lib_Memzero0_memzero(kp_s, 16U, uint8_t, void *);
  Lib_Memzero0_memzero(seed_se_k, 32U, uint8_t, void *);
  Lib_Memzero0_memzero(mu_decode, 16U, uint8_t, void *);
  return 0U;
}